

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint postProcessScanlines(uchar *out,uchar *in,uint w,uint h,LodePNGInfo *info_png)

{
  uint uVar1;
  uint uVar2;
  uint local_13c;
  uint error_2;
  uint i;
  size_t passstart [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  uint passh [7];
  uint passw [7];
  uint error_1;
  uint error;
  uint bpp;
  LodePNGInfo *info_png_local;
  uint h_local;
  uint w_local;
  uchar *in_local;
  uchar *out_local;
  
  uVar1 = lodepng_get_bpp(&info_png->color);
  if (uVar1 == 0) {
    return 0x1f;
  }
  if (info_png->interlace_method == 0) {
    if ((uVar1 < 8) && (w * uVar1 != (w * uVar1 + 7 & 0xfffffff8))) {
      uVar2 = unfilter(in,in,w,h,uVar1);
      if (uVar2 != 0) {
        return uVar2;
      }
      removePaddingBits(out,in,(ulong)(w * uVar1),(ulong)(w * uVar1 + 7 & 0xfffffff8),h);
    }
    else {
      uVar1 = unfilter(out,in,w,h,uVar1);
      if (uVar1 != 0) {
        return uVar1;
      }
    }
  }
  else {
    Adam7_getpassvalues(passh + 6,(uint *)(filter_passstart + 7),padded_passstart + 7,passstart + 7,
                        (size_t *)&error_2,w,h,uVar1);
    for (local_13c = 0; local_13c != 7; local_13c = local_13c + 1) {
      uVar2 = unfilter(in + passstart[(ulong)local_13c + 7],
                       in + padded_passstart[(ulong)local_13c + 7],passh[(ulong)local_13c + 6],
                       passh[(ulong)local_13c - 2],uVar1);
      if (uVar2 != 0) {
        return uVar2;
      }
      if (uVar1 < 8) {
        removePaddingBits(in + *(long *)(&error_2 + (ulong)local_13c * 2),
                          in + passstart[(ulong)local_13c + 7],
                          (ulong)(passh[(ulong)local_13c + 6] * uVar1),
                          (ulong)(passh[(ulong)local_13c + 6] * uVar1 + 7 & 0xfffffff8),
                          passh[(ulong)local_13c - 2]);
      }
    }
    Adam7_deinterlace(out,in,w,h,uVar1);
  }
  return 0;
}

Assistant:

static unsigned postProcessScanlines(unsigned char* out, unsigned char* in,
                                     unsigned w, unsigned h, const LodePNGInfo* info_png)
{
  /*
  This function converts the filtered-padded-interlaced data into pure 2D image buffer with the PNG's colortype.
  Steps:
  *) if no Adam7: 1) unfilter 2) remove padding bits (= posible extra bits per scanline if bpp < 8)
  *) if adam7: 1) 7x unfilter 2) 7x remove padding bits 3) Adam7_deinterlace
  NOTE: the in buffer will be overwritten with intermediate data!
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  if(bpp == 0) return 31; /*error: invalid colortype*/

  if(info_png->interlace_method == 0)
  {
    if(bpp < 8 && w * bpp != ((w * bpp + 7) / 8) * 8)
    {
      CERROR_TRY_RETURN(unfilter(in, in, w, h, bpp));
      removePaddingBits(out, in, w * bpp, ((w * bpp + 7) / 8) * 8, h);
    }
    /*we can immediatly filter into the out buffer, no other steps needed*/
    else CERROR_TRY_RETURN(unfilter(out, in, w, h, bpp));
  }
  else /*interlace_method is 1 (Adam7)*/
  {
    unsigned passw[7], passh[7]; size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned i;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    for(i = 0; i != 7; ++i)
    {
      CERROR_TRY_RETURN(unfilter(&in[padded_passstart[i]], &in[filter_passstart[i]], passw[i], passh[i], bpp));
      /*TODO: possible efficiency improvement: if in this reduced image the bits fit nicely in 1 scanline,
      move bytes instead of bits or move not at all*/
      if(bpp < 8)
      {
        /*remove padding bits in scanlines; after this there still may be padding
        bits between the different reduced images: each reduced image still starts nicely at a byte*/
        removePaddingBits(&in[passstart[i]], &in[padded_passstart[i]], passw[i] * bpp,
                          ((passw[i] * bpp + 7) / 8) * 8, passh[i]);
      }
    }

    Adam7_deinterlace(out, in, w, h, bpp);
  }

  return 0;
}